

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall
VmaVector<VkMappedMemoryRange,_VmaStlAllocator<VkMappedMemoryRange>_>::shrink_to_fit
          (VmaVector<VkMappedMemoryRange,_VmaStlAllocator<VkMappedMemoryRange>_> *this)

{
  ulong count;
  VkMappedMemoryRange *__dest;
  
  count = this->m_Count;
  if (count < this->m_Capacity) {
    if (count == 0) {
      __dest = (VkMappedMemoryRange *)0x0;
    }
    else {
      __dest = VmaAllocateArray<VkMappedMemoryRange>((this->m_Allocator).m_pCallbacks,count);
      memcpy(__dest,this->m_pArray,this->m_Count * 0x28);
    }
    VmaFree((this->m_Allocator).m_pCallbacks,this->m_pArray);
    this->m_Capacity = this->m_Count;
    this->m_pArray = __dest;
  }
  return;
}

Assistant:

void VmaVector<T, AllocatorT>::shrink_to_fit()
{
    if (m_Capacity > m_Count)
    {
        T* newArray = VMA_NULL;
        if (m_Count > 0)
        {
            newArray = VmaAllocateArray<T>(m_Allocator.m_pCallbacks, m_Count);
            memcpy(newArray, m_pArray, m_Count * sizeof(T));
        }
        VmaFree(m_Allocator.m_pCallbacks, m_pArray);
        m_Capacity = m_Count;
        m_pArray = newArray;
    }
}